

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O1

Formula * Kernel::Formula::createITE(Formula *condition,Formula *thenArg,Formula *elseArg)

{
  TermList thenBranch;
  TermList elseBranch;
  TermList branchSort;
  Term *pTVar1;
  Formula *pFVar2;
  void **head;
  
  thenBranch._content = (uint64_t)Term::createFormula(thenArg);
  elseBranch._content = (uint64_t)Term::createFormula(elseArg);
  branchSort = AtomicSort::boolSort();
  pTVar1 = Term::createITE(condition,thenBranch,elseBranch,branchSort);
  pFVar2 = (Formula *)
           ::Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  pFVar2->_connective = BOOL_TERM;
  (pFVar2->_label)._M_dataplus._M_p = (pointer)&(pFVar2->_label).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pFVar2->_label,DEFAULT_LABEL_abi_cxx11_,
             DAT_00b7c330 + DEFAULT_LABEL_abi_cxx11_);
  *(Term **)(pFVar2 + 1) = pTVar1;
  return pFVar2;
}

Assistant:

Formula* Formula::createITE(Formula* condition, Formula* thenArg, Formula* elseArg)
{
  TermList thenTerm(Term::createFormula(thenArg));
  TermList elseTerm(Term::createFormula(elseArg));
  TermList iteTerm(Term::createITE(condition, thenTerm, elseTerm, AtomicSort::boolSort()));
  return new BoolTermFormula(iteTerm);
}